

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Computations.h
# Opt level: O2

void Contract_dyn(box *P,deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                         *d_all_mes_vector,deque<double,_std::allocator<double>_> *alpha_mes_vector,
                 deque<double,_std::allocator<double>_> *t_history_vector,
                 deque<interval,_std::allocator<interval>_> *xhat_history_vector,
                 deque<interval,_std::allocator<interval>_> *yhat_history_vector,
                 deque<interval,_std::allocator<interval>_> *psihat_history_vector,
                 deque<interval,_std::allocator<interval>_> *vrxhat_history_vector,double *d_max_err
                 ,double *alpha_max_err,int *sdir,interval *alphashat,
                 vector<double,_std::allocator<double>_> *walls_xa,
                 vector<double,_std::allocator<double>_> *walls_ya,
                 vector<double,_std::allocator<double>_> *walls_xb,
                 vector<double,_std::allocator<double>_> *walls_yb,
                 vector<double,_std::allocator<double>_> *circles_x,
                 vector<double,_std::allocator<double>_> *circles_y,
                 vector<double,_std::allocator<double>_> *circles_r)

{
  long __n;
  double dVar1;
  pointer piVar2;
  vector<double,_std::allocator<double>_> cx;
  vector<double,_std::allocator<double>_> cy;
  vector<double,_std::allocator<double>_> r;
  box *x;
  _Deque_iterator<double,_double_&,_double_*> *p_Var3;
  _Deque_iterator<std::vector<interval,_std::allocator<interval>_>,_std::vector<interval,_std::allocator<interval>_>_&,_std::vector<interval,_std::allocator<interval>_>_*>
  *this;
  bool bVar4;
  size_type sVar5;
  reference pdVar6;
  reference pvVar7;
  reference piVar8;
  interval *piVar9;
  reference piVar10;
  iterator *this_00;
  iterator *this_01;
  iterator *this_02;
  int iVar11;
  iterator *this_03;
  long lVar12;
  long __n_00;
  undefined8 uVar13;
  undefined1 in_stack_fffffffffffffc28 [12];
  int iVar14;
  double local_3c0;
  interval xk;
  box Pxyj;
  box Pt;
  interval xt;
  interval yk;
  vector<box,_std::allocator<box>_> Pi;
  interval yt;
  interval local_2f0;
  box *local_2d8;
  _Deque_iterator<double,_double_&,_double_*> *local_2d0;
  _Deque_iterator<std::vector<interval,_std::allocator<interval>_>,_std::vector<interval,_std::allocator<interval>_>_&,_std::vector<interval,_std::allocator<interval>_>_*>
  *local_2c8;
  _Deque_iterator<double,_double_&,_double_*> *local_2c0;
  vector<box,_std::allocator<box>_> Pj;
  interval dhat;
  vector<int,_std::allocator<int>_> Pigroup;
  interval local_270;
  interval local_258;
  interval local_240;
  interval local_228;
  _Vector_base<double,_std::allocator<double>_> local_210;
  _Vector_base<double,_std::allocator<double>_> local_1f8;
  _Vector_base<double,_std::allocator<double>_> local_1e0;
  _Vector_base<double,_std::allocator<double>_> local_1c8;
  _Vector_base<double,_std::allocator<double>_> local_1b0;
  _Vector_base<double,_std::allocator<double>_> local_198;
  interval alphahat;
  interval local_168;
  interval local_150;
  interval local_138;
  interval local_120;
  interval local_108;
  interval local_f0;
  _Vector_base<double,_std::allocator<double>_> local_d8;
  interval local_c0;
  interval local_a8;
  interval local_90;
  interval local_78;
  interval local_60;
  interval local_48;
  
  Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_2d8 = P;
  std::vector<box,_std::allocator<box>_>::clear(&Pi);
  local_2d0 = &(alpha_mes_vector->super__Deque_base<double,_std::allocator<double>_>)._M_impl.
               super__Deque_impl_data._M_start;
  local_2c8 = &(d_all_mes_vector->
               super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start;
  this_03 = &(xhat_history_vector->super__Deque_base<interval,_std::allocator<interval>_>)._M_impl.
             super__Deque_impl_data._M_start;
  this_00 = &(yhat_history_vector->super__Deque_base<interval,_std::allocator<interval>_>)._M_impl.
             super__Deque_impl_data._M_start;
  this_02 = &(psihat_history_vector->super__Deque_base<interval,_std::allocator<interval>_>)._M_impl
             .super__Deque_impl_data._M_start;
  local_2c0 = &(t_history_vector->super__Deque_base<double,_std::allocator<double>_>)._M_impl.
               super__Deque_impl_data._M_start;
  this_01 = &(vrxhat_history_vector->super__Deque_base<interval,_std::allocator<interval>_>)._M_impl
             .super__Deque_impl_data._M_start;
  iVar11 = 0;
  do {
    iVar14 = iVar11;
    sVar5 = std::deque<double,_std::allocator<double>_>::size(alpha_mes_vector);
    x = local_2d8;
    if ((int)sVar5 <= iVar11) {
      if (Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_finish
          != Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
             _M_start) {
        C_acc_opt(local_2d8,&Pi);
        C_acc_opt(x,&Pi);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&Pigroup.super__Vector_base<int,_std::allocator<int>_>);
      std::vector<box,_std::allocator<box>_>::~vector(&Pi);
      return;
    }
    Pj.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    Pj.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    Pj.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<box,_std::allocator<box>_>::clear(&Pj);
    p_Var3 = local_2d0;
    pdVar6 = std::_Deque_iterator<double,_double_&,_double_*>::operator[](local_2d0,(long)iVar14);
    dhat.inf = *pdVar6 - *alpha_max_err;
    pdVar6 = std::_Deque_iterator<double,_double_&,_double_*>::operator[](p_Var3,(long)iVar14);
    xt.inf = *pdVar6 + *alpha_max_err;
    interval::interval(&alphahat,&dhat.inf,&xt.inf);
    lVar12 = 0;
    while( true ) {
      this = local_2c8;
      pvVar7 = std::
               _Deque_iterator<std::vector<interval,_std::allocator<interval>_>,_std::vector<interval,_std::allocator<interval>_>_&,_std::vector<interval,_std::allocator<interval>_>_*>
               ::operator[](local_2c8,(long)iVar14);
      if ((int)(((long)(pvVar7->super__Vector_base<interval,_std::allocator<interval>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(pvVar7->super__Vector_base<interval,_std::allocator<interval>_>)._M_impl.
                      super__Vector_impl_data._M_start) / 0x18) <= lVar12) break;
      pvVar7 = std::
               _Deque_iterator<std::vector<interval,_std::allocator<interval>_>,_std::vector<interval,_std::allocator<interval>_>_&,_std::vector<interval,_std::allocator<interval>_>_*>
               ::operator[](this,(long)iVar14);
      piVar2 = (pvVar7->super__Vector_base<interval,_std::allocator<interval>_>)._M_impl.
               super__Vector_impl_data._M_start;
      xk.inf = *d_max_err;
      yt.inf = -xk.inf;
      interval::interval(&xt,&yt.inf,&xk.inf);
      operator+(piVar2 + lVar12,&xt);
      piVar8 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                         (this_03,(long)iVar14);
      interval::interval(&local_48,piVar8);
      piVar8 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                         (this_00,(long)iVar14);
      interval::interval(&local_78,piVar8);
      box::box(&Pxyj,(vector<interval,_std::allocator<interval>_> *)&local_48,
               (vector<interval,_std::allocator<interval>_> *)&local_78);
      xt.inf = -INFINITY;
      yt.inf = INFINITY;
      interval::interval(&local_90,&xt.inf,&yt.inf);
      xk.inf = -INFINITY;
      yk.inf = INFINITY;
      interval::interval(&local_60,&xk.inf,&yk.inf);
      box::box(&Pt,(vector<interval,_std::allocator<interval>_> *)&local_90,
               (vector<interval,_std::allocator<interval>_> *)&local_60);
      interval::interval(&local_a8,&dhat);
      operator*(&yt,(double)*sdir,&alphahat);
      operator+(&yt,alphashat);
      piVar8 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                         (this_02,(long)iVar14);
      operator+(&xt,piVar8);
      BoxTranslate(&Pxyj,&Pt,&local_a8,&local_c0,1);
      piVar9 = box::operator[](&Pt,1);
      interval::interval(&xt,piVar9);
      piVar9 = box::operator[](&Pt,2);
      interval::interval(&yt,piVar9);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_210,walls_xa);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_198,walls_ya);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_1b0,walls_xb);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_1c8,walls_yb);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_1e0,circles_x);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_1f8,circles_y);
      uVar13 = 0x1632f3;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_d8,circles_r);
      cx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&local_1f8;
      cx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&local_1e0;
      cx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)&local_d8;
      cy.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._8_12_
           = in_stack_fffffffffffffc28;
      cy.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)uVar13;
      cy.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = iVar14;
      r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_3c0;
      r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)this_02;
      r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)xk.inf;
      CPointInSegmentsOrCircles
                (&xt,&yt,(vector<double,_std::allocator<double>_> *)&local_210,
                 (vector<double,_std::allocator<double>_> *)&local_198,
                 (vector<double,_std::allocator<double>_> *)&local_1b0,
                 (vector<double,_std::allocator<double>_> *)&local_1c8,cx,cy,r);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1f8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1e0);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1c8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1b0);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_198);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_210);
      if ((xt.isEmpty == false) && (yt.isEmpty == false)) {
        interval::interval(&local_f0,&xt);
        interval::interval(&local_108,&yt);
        box::box((box *)&xk,(vector<interval,_std::allocator<interval>_> *)&local_f0,
                 (vector<interval,_std::allocator<interval>_> *)&local_108);
        box::operator=(&Pt,(box *)&xk);
        box::~box((box *)&xk);
        interval::interval(&local_120,&dhat);
        operator*(&yk,(double)*sdir,&alphahat);
        operator+(&yk,alphashat);
        piVar8 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                           (this_02,(long)iVar14);
        operator+(&xk,piVar8);
        BoxTranslate(&Pxyj,&Pt,&local_120,&local_138,-1);
        piVar8 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                           (this_03,(long)iVar14);
        piVar9 = box::operator[](&Pxyj,1);
        operator&(&xk,piVar8,piVar9);
        piVar8 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                           (this_00,(long)iVar14);
        piVar9 = box::operator[](&Pxyj,2);
        operator&(&yk,piVar8,piVar9);
        __n_00 = (long)iVar14;
        while (sVar5 = std::deque<double,_std::allocator<double>_>::size(alpha_mes_vector),
              p_Var3 = local_2c0, __n_00 < (int)sVar5 + -1) {
          __n = __n_00 + 1;
          pdVar6 = std::_Deque_iterator<double,_double_&,_double_*>::operator[](local_2c0,__n);
          dVar1 = *pdVar6;
          pdVar6 = std::_Deque_iterator<double,_double_&,_double_*>::operator[](p_Var3,__n_00);
          local_3c0 = dVar1 - *pdVar6;
          piVar8 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[](this_03,__n);
          piVar10 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                              (this_01,__n_00);
          operator*(&local_258,local_3c0,piVar10);
          piVar10 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                              (this_02,__n_00);
          Cos(&local_270,piVar10);
          operator*(&local_240,&local_258,&local_270);
          operator+(&xk,&local_240);
          operator&(&local_2f0,piVar8,&local_228);
          interval::operator=(&xk,&local_2f0);
          piVar8 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[](this_00,__n);
          piVar10 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                              (this_01,__n_00);
          operator*(&local_258,local_3c0,piVar10);
          piVar10 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                              (this_02,__n_00);
          Sin(&local_270,piVar10);
          operator*(&local_240,&local_258,&local_270);
          operator+(&yk,&local_240);
          operator&(&local_2f0,piVar8,&local_228);
          interval::operator=(&yk,&local_2f0);
          if ((xk.isEmpty != false) || (__n_00 = __n, (yk.isEmpty & 1U) != 0)) break;
        }
        interval::interval(&local_150,&xk);
        interval::interval(&local_168,&yk);
        box::box((box *)&local_2f0,(vector<interval,_std::allocator<interval>_> *)&local_150,
                 (vector<interval,_std::allocator<interval>_> *)&local_168);
        box::operator=(&Pxyj,(box *)&local_2f0);
        box::~box((box *)&local_2f0);
        bVar4 = box::IsEmpty(&Pxyj);
        if (!bVar4) {
          std::vector<box,_std::allocator<box>_>::push_back(&Pi,&Pxyj);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&Pigroup,(value_type_conflict3 *)&stack0xfffffffffffffc34);
        }
      }
      box::~box(&Pt);
      box::~box(&Pxyj);
      lVar12 = lVar12 + 1;
    }
    std::vector<box,_std::allocator<box>_>::~vector(&Pj);
    iVar11 = iVar14 + 1;
  } while( true );
}

Assistant:

inline void Contract_dyn(box& P, deque< vector<interval> >& d_all_mes_vector, deque<double>& alpha_mes_vector, 
						 deque<double>& t_history_vector, deque<interval>& xhat_history_vector, deque<interval>& yhat_history_vector, 
						 deque<interval>& psihat_history_vector, deque<interval>& vrxhat_history_vector, 
						 double& d_max_err, double& alpha_max_err, int& sdir, interval& alphashat, 
						 vector<double>& walls_xa, vector<double>& walls_ya, vector<double>& walls_xb, vector<double>& walls_yb, 
						 vector<double>& circles_x, vector<double>& circles_y, vector<double>& circles_r)
{
	int i = 0, j = 0, k = 0;
	vector<box> Pi;
	vector<int> Pigroup;

	Pi.clear();
	Pigroup.clear();
	for (i = 0; i < (int)alpha_mes_vector.size(); i++)
	{
		vector<box> Pj;
		Pj.clear();
		interval alphahat = interval(alpha_mes_vector[i]-alpha_max_err,alpha_mes_vector[i]+alpha_max_err);
		for (j = 0; j < (int)d_all_mes_vector[i].size(); j++)
		{
			interval dhat = d_all_mes_vector[i][j]+interval(-d_max_err,+d_max_err);
			//
			// Activate only if using getfirst or getlast...
			// If no obstacle found...
			//if ((Center(d_all_mes_vector[i][j]) < 0)||(Center(d_all_mes_vector[i][j]) > rangescale)||(d_all_mes_vector[i][j].isEmpty)) 
			//{
			//	dhat = interval(rangescale-d_max_err,oo);
			//	printf("Bad dhat\n");
			//}
			//

			box Pxyj = box(xhat_history_vector[i],yhat_history_vector[i]);
			box Pt = box(interval(-oo,oo),interval(-oo,oo)); 
			BoxTranslate(Pxyj, Pt, dhat, sdir*alphahat+alphashat+psihat_history_vector[i], 1);
			interval xt = Pt[1];
			interval yt = Pt[2];
			CPointInSegmentsOrCircles(xt,yt,walls_xa,walls_ya,walls_xb,walls_yb,circles_x,circles_y,circles_r);
			if ((!xt.isEmpty)&&(!yt.isEmpty))
			{
				Pt = box(xt,yt);
				BoxTranslate(Pxyj, Pt, dhat, sdir*alphahat+alphashat+psihat_history_vector[i], -1);

				// Propagate forward to current position...
				interval xk = xhat_history_vector[i] & Pxyj[1];
				interval yk = yhat_history_vector[i] & Pxyj[2];
				for (k = i; k < (int)alpha_mes_vector.size()-1; k++)
				{
					double dt = t_history_vector[k+1]-t_history_vector[k];
					xk = xhat_history_vector[k+1] & (xk+dt*vrxhat_history_vector[k]*Cos(psihat_history_vector[k]));
					yk = yhat_history_vector[k+1] & (yk+dt*vrxhat_history_vector[k]*Sin(psihat_history_vector[k]));
					if ((xk.isEmpty)||(yk.isEmpty)) break;
				}
				Pxyj = box(xk,yk);

				if (!Pxyj.IsEmpty())
				{
					//Pj.push_back(Pxyj);
					Pi.push_back(Pxyj);
					Pigroup.push_back(i);
				}
			}
		}
		//box Pxy = Union(Pj);
		//if (!Pxy.IsEmpty())
		//{
		//	Pi.push_back(Pxy);
		//}
	}
	if (Pi.size() > 0)
	{
		//C_q_in_group(P, alpha_mes_vector.size()-nb_outliers, Pi, Pigroup, alpha_mes_vector.size());
		//C_acc_group(P, Pi, Pigroup, alpha_mes_vector.size());
		//C_q_in(P, Pi.size()-nb_outliers, Pi);
		//C_q_in(P, alpha_mes_vector.size()-nb_outliers, Pi);
		C_acc_opt(P, Pi);
		C_acc_opt(P, Pi);
	}
}